

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeCallRef(TranslateToFuzzReader *this,Type type)

{
  Module *pMVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint32_t uVar5;
  Expression *pEVar6;
  Type *pTVar7;
  uintptr_t *puVar8;
  HeapType target;
  CallRef *pCVar9;
  long extraout_RDX;
  long extraout_RDX_00;
  uintptr_t extraout_RDX_01;
  int iVar10;
  bool isReturn;
  Type local_78;
  Expression *local_70;
  undefined1 auStack_68 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  Iterator __begin1;
  
  if ((this->fuzzParams->super_FuzzParams).TRIES != 0) {
    iVar10 = 0;
    do {
      pMVar1 = this->wasm;
      if (*(long *)(pMVar1 + 0x18) == *(long *)(pMVar1 + 0x20)) break;
      uVar5 = Random::upTo(&this->random,
                           (uint32_t)
                           ((ulong)(*(long *)(pMVar1 + 0x20) - *(long *)(pMVar1 + 0x18)) >> 3));
      puVar2 = *(undefined8 **)(*(long *)(pMVar1 + 0x18) + (ulong)uVar5 * 8);
      if ((type.id == 1) && (((byte)this->wasm[0x178] & 0x80) != 0)) {
        wasm::HeapType::getSignature();
        wasm::HeapType::getSignature();
        isReturn = extraout_RDX == extraout_RDX_00;
      }
      else {
        isReturn = false;
      }
      wasm::HeapType::getSignature();
      if ((isReturn != false) || (extraout_RDX_01 == type.id)) {
        auStack_68 = (undefined1  [8])0x0;
        args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.id = wasm::HeapType::getSignature();
        args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&local_78;
        __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)0x0;
        pTVar7 = (Type *)Type::size((Type *)args.
                                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (pTVar7 != (Type *)0x0) {
          do {
            do {
              puVar8 = (uintptr_t *)
                       wasm::Type::Iterator::operator*
                                 ((Iterator *)
                                  &args.
                                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_70 = make(this,(Type)*puVar8);
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              emplace_back<wasm::Expression*>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                         &local_70);
              __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                   (Type *)((long)&(__begin1.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent)->id + 1);
            } while (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent != pTVar7);
          } while ((Type *)args.
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage != &local_78);
        }
        uVar3 = *puVar2;
        uVar4 = puVar2[1];
        target.id = (uintptr_t)
                    MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x20,8);
        *(undefined1 *)target.id = 0x2b;
        *(undefined8 *)(target.id + 8) = 0;
        *(undefined8 *)(target.id + 0x10) = uVar3;
        *(undefined8 *)(target.id + 0x18) = uVar4;
        wasm::RefFunc::finalize(target);
        pCVar9 = Builder::
                 makeCallRef<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                           (&this->builder,(Expression *)target.id,
                            (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                            auStack_68,type,isReturn);
        if (auStack_68 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_68,
                          (long)args.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
        }
        return (Expression *)pCVar9;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != (this->fuzzParams->super_FuzzParams).TRIES);
  }
  pEVar6 = makeTrivial(this,type);
  return pEVar6;
}

Assistant:

Expression* TranslateToFuzzReader::makeCallRef(Type type) {
  // look for a call target with the right type
  Function* target;
  bool isReturn;
  decltype(fuzzParams->TRIES) i = 0;
  while (1) {
    if (i == fuzzParams->TRIES || wasm.functions.empty()) {
      // We can't find a proper target, give up.
      return makeTrivial(type);
    }
    // TODO: handle unreachable
    target = wasm.functions[upTo(wasm.functions.size())].get();
    isReturn = type == Type::unreachable && wasm.features.hasTailCall() &&
               funcContext->func->getResults() == target->getResults();
    if (target->getResults() == type || isReturn) {
      break;
    }
    i++;
  }
  std::vector<Expression*> args;
  for (const auto& type : target->getParams()) {
    args.push_back(make(type));
  }
  // TODO: half the time make a completely random item with that type.
  return builder.makeCallRef(
    builder.makeRefFunc(target->name, target->type), args, type, isReturn);
}